

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

ExecutionResult __thiscall nigel::AST_Parser::onExecute(AST_Parser *this,CodeBase *base)

{
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *plVar1;
  element_type *peVar2;
  AstBlock *__tmp;
  AST_Parser *this_00;
  _List_node_base *p_Var3;
  shared_ptr<nigel::AstExpr> expr;
  undefined1 local_49;
  shared_ptr<nigel::AstBlock> local_48;
  element_type *local_38;
  AST_Parser *pAStack_30;
  
  (this->currItr)._M_node =
       (base->lexerStruct).
       super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  this->base = base;
  std::__shared_ptr<nigel::AstBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<nigel::AstBlock>>
            ((__shared_ptr<nigel::AstBlock,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8,
             (allocator<nigel::AstBlock> *)&local_49);
  local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_30;
  peVar2 = local_38;
  local_38 = (element_type *)0x0;
  pAStack_30 = (AST_Parser *)0x0;
  (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  this_00 = (AST_Parser *)
            (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (AST_Parser *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    this_00 = pAStack_30;
    if (pAStack_30 != (AST_Parser *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_30);
    }
    local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  fillSFR(this_00,&local_48);
  if (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::deque<std::shared_ptr<nigel::AstBlock>,_std::allocator<std::shared_ptr<nigel::AstBlock>_>_>::
  push_back(&(this->blockStack).c,&base->globalAst);
  this->finishedParsing = false;
  do {
    resolveNextExpr((AST_Parser *)&stack0xffffffffffffffc8);
    if (pAStack_30 != (AST_Parser *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAStack_30);
    }
  } while (this->finishedParsing == false);
  plVar1 = &(this->super_BuilderExecutable).notificationList;
  p_Var3 = (_List_node_base *)plVar1;
  do {
    p_Var3 = (((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar1) break;
  } while (0x7ffd < *(int *)p_Var3[1]._M_next - 1U);
  if (base->printAST == true) {
    printAST(this,base);
  }
  return (uint)(p_Var3 != (_List_node_base *)plVar1) * 5;
}

Assistant:

ExecutionResult AST_Parser::onExecute( CodeBase &base )
	{
		//Set current iterator
		currItr = base.lexerStruct.begin();
		this->base = &base;

		base.globalAst = std::make_shared<AstBlock>();
		fillSFR( base.globalAst );
		blockStack.push( base.globalAst );

		finishedParsing = false;

		while( !finishedParsing )//Iterate the lexer
		{
			std::shared_ptr<AstExpr> expr = resolveNextExpr();
		}

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( base.printAST ) printAST( base );

		if( hasError ) return ExecutionResult::astParsingFailed;
		else return ExecutionResult::success;
	}